

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandFxch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fVeryVerbose;
  int iVar3;
  uint fVerbose;
  char *pcVar4;
  bool bVar5;
  int local_34;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_34 = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  fVeryVerbose = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Nvwh"), iVar3 = globalUtilOptind, iVar1 == 0x77) {
        fVeryVerbose = fVeryVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          pcVar2 = "Empty network.\n";
        }
        else if (pNtk->nObjCounts[7] == 0) {
          pcVar2 = "The network does not have internal nodes.\n";
        }
        else {
          bVar5 = pNtk->ntkType == ABC_NTK_LOGIC;
          if (bVar5) {
            if ((bVar5) && (pNtk->ntkFunc == ABC_FUNC_SOP)) {
              Abc_NtkFxchPerform(pNtk,local_34,fVerbose,fVeryVerbose);
              return 0;
            }
            pcVar2 = 
            "Fast extract can only be applied to a logic network with SOP local functions (run \"bdd; sop\").\n"
            ;
          }
          else {
            pcVar2 = 
            "Fast extract can only be applied to a logic network (run \"renode\" or \"if\").\n";
          }
        }
        iVar3 = -1;
        goto LAB_0020575c;
      }
      if (iVar1 != 0x76) break;
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 != 0x4e) goto LAB_00205697;
    if (argc <= globalUtilOptind) break;
    local_34 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if (local_34 < 0) {
LAB_00205697:
      Abc_Print(-2,"usage: fxch [-N <num>] [-svwh]\n");
      Abc_Print(-2,"\t           performs fast extract with cube hashing on the current network\n");
      Abc_Print(-2,
                "\t-N <num> : max number of divisors to extract during this run [default = unused]\n"
               );
      pcVar4 = "yes";
      pcVar2 = "yes";
      if (fVerbose == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-v       : print verbose information [default = %s]\n",pcVar2);
      if (fVeryVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w       : print additional information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      Abc_Print(-2,"\t\n");
      Abc_Print(-2,
                "\t           This command was contributed by Bruno Schmitt from UFRGS in May 2016.\n"
               );
      pcVar2 = "\t           The author can be contacted as boschmitt at inf.ufrgs.br\n";
      iVar3 = -2;
LAB_0020575c:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_00205697;
}

Assistant:

static int Abc_CommandFxch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkFxchPerform( Abc_Ntk_t * pNtk, int nMaxDivExt, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);

    int c,
        nMaxDivExt = 0,
        fVerbose = 0,
        fVeryVerbose = 0;

    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "Nvwh")) != EOF )
    {
        switch (c)
        {
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                    goto usage;
                }
                nMaxDivExt = atoi( argv[globalUtilOptind] );
                globalUtilOptind++;

                if ( nMaxDivExt < 0 )
                    goto usage;
                break;

            case 'v':
                fVerbose ^= 1;
                break;

            case 'w':
                fVeryVerbose ^= 1;
                break;

            case 'h':
                goto usage;
                break;

            default:
                goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkNodeNum( pNtk ) == 0 )
    {
        Abc_Print( -1, "The network does not have internal nodes.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic( pNtk ) )
    {
        Abc_Print( -1, "Fast extract can only be applied to a logic network (run \"renode\" or \"if\").\n" );
        return 1;
    }
    if ( !Abc_NtkIsSopLogic( pNtk ) )
    {
        Abc_Print( -1, "Fast extract can only be applied to a logic network with SOP local functions (run \"bdd; sop\").\n" );
        return 1;
    }

    Abc_NtkFxchPerform( pNtk, nMaxDivExt, fVerbose, fVeryVerbose );

    return 0;

usage:
    Abc_Print( -2, "usage: fxch [-N <num>] [-svwh]\n");
    Abc_Print( -2, "\t           performs fast extract with cube hashing on the current network\n");
    Abc_Print( -2, "\t-N <num> : max number of divisors to extract during this run [default = unused]\n" );
    Abc_Print( -2, "\t-v       : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : print additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t\n" );
    Abc_Print( -2, "\t           This command was contributed by Bruno Schmitt from UFRGS in May 2016.\n" );
    Abc_Print( -2, "\t           The author can be contacted as boschmitt at inf.ufrgs.br\n" );
    return 1;
}